

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser2_syntax.c
# Opt level: O3

RK_S32 h265d_syntax_fill_slice(void *ctx,RK_S32 input_index)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined2 *ptr;
  size_t sVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  undefined2 *puVar11;
  long lVar12;
  RK_S32 _out;
  MppBuffer streambuf;
  BitReadCtx_t gb_cxt;
  uint local_a4;
  long local_a0;
  undefined2 *local_98;
  MppBuffer local_90;
  BitReadCtx_t local_88;
  
  lVar2 = *ctx;
  lVar9 = *(long *)(lVar2 + 0x25730);
  local_90 = (MppBuffer)0x0;
  if (input_index == -1) {
    ptr = (undefined2 *)mpp_packet_get_data(*(MppPacket *)(lVar2 + 0x25728));
    sVar5 = mpp_packet_get_size(*(MppPacket *)(lVar2 + 0x25728));
    if ((long)*(int *)(lVar2 + 0x1150) < 1) {
      uVar7 = 0;
    }
    else {
      lVar12 = 0;
      iVar8 = 0;
      do {
        iVar10 = iVar8 + *(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar12);
        iVar8 = iVar10 + 4;
        lVar12 = lVar12 + 0x18;
      } while ((long)*(int *)(lVar2 + 0x1150) * 0x18 != lVar12);
      uVar7 = iVar10 + 0x13U & 0xfffffff0;
    }
    if ((uint)sVar5 < uVar7 + 0x40) {
      mpp_osal_free("h265d_syntax_fill_slice",ptr);
      sVar5 = (size_t)(int)(uVar7 + 0x2c3f & 0xfffffc00);
      ptr = (undefined2 *)mpp_osal_malloc("h265d_syntax_fill_slice",sVar5);
      mpp_packet_set_data(*(MppPacket *)(lVar2 + 0x25728),ptr);
      mpp_packet_set_size(*(MppPacket *)(lVar2 + 0x25728),sVar5);
    }
    puVar11 = (undefined2 *)0x0;
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)(lVar2 + 0x25718),input_index,SLOT_BUFFER,&local_90);
    ptr = (undefined2 *)mpp_buffer_get_ptr_with_caller(local_90,"h265d_syntax_fill_slice");
    puVar11 = ptr;
    if (ptr == (undefined2 *)0x0) {
      return -3;
    }
  }
  iVar8 = *(int *)(lVar2 + 0x1150);
  if (*(int *)(lVar9 + 0x1e78) < iVar8) {
    if (*(void **)(lVar9 + 0x1e58) != (void *)0x0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)(lVar9 + 0x1e58));
      iVar8 = *(int *)(lVar2 + 0x1150);
    }
    *(undefined8 *)(lVar9 + 0x1e58) = 0;
    pvVar6 = mpp_osal_malloc("h265d_syntax_fill_slice",(long)iVar8 * 0xc);
    *(void **)(lVar9 + 0x1e58) = pvVar6;
    if (pvVar6 == (void *)0x0) {
      return -0x3ee;
    }
    if (*(void **)(lVar9 + 0x1e70) != (void *)0x0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)(lVar9 + 0x1e70));
    }
    *(undefined8 *)(lVar9 + 0x1e70) = 0;
    pvVar6 = mpp_osal_malloc("h265d_syntax_fill_slice",(long)*(int *)(lVar2 + 0x1150) * 0xc);
    *(void **)(lVar9 + 0x1e70) = pvVar6;
    if (pvVar6 == (void *)0x0) {
      return -0x3ee;
    }
    iVar8 = *(int *)(lVar2 + 0x1150);
    *(int *)(lVar9 + 0x1e78) = iVar8;
  }
  local_a0 = lVar9;
  local_98 = puVar11;
  if (iVar8 < 1) {
    iVar8 = 0;
    uVar7 = 0;
  }
  else {
    lVar9 = 0;
    lVar12 = 0;
    uVar7 = 0;
    iVar8 = 0;
    do {
      mpp_set_bitread_ctx(&local_88,*(RK_U8 **)(*(long *)(lVar2 + 0x1148) + 0x10 + lVar9),
                          *(RK_S32 *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar9));
      mpp_set_bitread_pseudo_code_type(&local_88,PSEUDO_CODE_H264_H265);
      local_88.ret = mpp_read_bits(&local_88,1,(RK_S32 *)&local_a4);
      if ((local_88.ret != MPP_OK) ||
         (local_88.ret = mpp_read_bits(&local_88,6,(RK_S32 *)&local_a4), local_88.ret != MPP_OK)) {
        return -0x3ec;
      }
      if (local_a4 < 0x20) {
        *(undefined1 *)(ptr + 1) = 1;
        *ptr = 0;
        memcpy((void *)((long)ptr + 3),*(void **)(*(long *)(lVar2 + 0x1148) + 0x10 + lVar9),
               (long)*(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar9));
        lVar3 = *(long *)(local_a0 + 0x1e58);
        lVar4 = (long)iVar8 * 0xc;
        uVar1 = *(undefined4 *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar9);
        *(undefined4 *)(lVar3 + 8 + lVar4) = 0;
        *(uint *)(lVar3 + lVar4) = uVar7 + 3;
        *(undefined4 *)(lVar3 + 4 + lVar4) = uVar1;
        lVar3 = *(long *)(local_a0 + 0x1e70);
        *(undefined4 *)(lVar3 + 8 + lVar4) = 0;
        *(undefined8 *)(lVar3 + lVar4) = 0;
        iVar10 = *(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar9);
        ptr = (undefined2 *)((long)ptr + (long)iVar10 + 3);
        uVar7 = uVar7 + iVar10 + 3;
        iVar8 = iVar8 + 1;
      }
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar12 < *(int *)(lVar2 + 0x1150));
  }
  *(int *)(local_a0 + 0x1e54) = iVar8;
  *(uint *)(local_a0 + 0x1e68) = uVar7;
  if (input_index == -1) {
    *(undefined8 *)(local_a0 + 0x1e60) = 0;
    mpp_packet_set_length(*(MppPacket *)(lVar2 + 0x25728),(ulong)uVar7);
  }
  else {
    *(undefined2 **)(local_a0 + 0x1e60) = local_98;
    mpp_buf_slot_set_flag(*(MppBufSlots *)(lVar2 + 0x25718),input_index,SLOT_CODEC_READY);
    mpp_buf_slot_set_flag(*(MppBufSlots *)(lVar2 + 0x25718),input_index,SLOT_HAL_INPUT);
  }
  return 0;
}

Assistant:

RK_S32 h265d_syntax_fill_slice(void *ctx, RK_S32 input_index)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    const HEVCContext *h = (const HEVCContext *)h265dctx->priv_data;
    h265d_dxva2_picture_context_t *ctx_pic = (h265d_dxva2_picture_context_t *)h->hal_pic_private;
    MppBuffer streambuf = NULL;
    RK_S32 i, count = 0;
    RK_U32 position = 0;
    RK_U8 *ptr = NULL;
    RK_U8 *current = NULL;
    RK_U32 size = 0, length = 0;
    // mpp_err("input_index = %d",input_index);
    if (-1 != input_index) {
        mpp_buf_slot_get_prop(h->packet_slots, input_index, SLOT_BUFFER, &streambuf);
        current = ptr = (RK_U8 *)mpp_buffer_get_ptr(streambuf);
        if (current == NULL) {
            return MPP_ERR_NULL_PTR;
        }
    } else {
        RK_S32 buff_size = 0;
        current = (RK_U8 *)mpp_packet_get_data(h->input_packet);
        size = (RK_U32)mpp_packet_get_size(h->input_packet);
        for (i = 0; i < h->nb_nals; i++) {
            length += h->nals[i].size + 4;
        }
        length = MPP_ALIGN(length, 16) + 64;
        if (length > size) {
            mpp_free(current);
            buff_size = MPP_ALIGN(length + 10 * 1024, 1024);
            current = mpp_malloc(RK_U8, buff_size);
            mpp_packet_set_data(h->input_packet, (void*)current);
            mpp_packet_set_size(h->input_packet, buff_size);
        }
    }
    if (ctx_pic->max_slice_num < h->nb_nals) {

        MPP_FREE(ctx_pic->slice_short);

        ctx_pic->slice_short = (DXVA_Slice_HEVC_Short *)mpp_malloc(DXVA_Slice_HEVC_Short, h->nb_nals);
        if (!ctx_pic->slice_short)
            return MPP_ERR_NOMEM;

        MPP_FREE(ctx_pic->slice_cut_param);

        ctx_pic->slice_cut_param = (DXVA_Slice_HEVC_Cut_Param *)mpp_malloc(DXVA_Slice_HEVC_Cut_Param, h->nb_nals);
        if (!ctx_pic->slice_cut_param)
            return MPP_ERR_NOMEM;

        ctx_pic->max_slice_num = h->nb_nals;
    }
    for (i = 0; i < h->nb_nals; i++) {
        static const RK_U8 start_code[] = {0, 0, 1 };
        static const RK_U32 start_code_size = sizeof(start_code);
        BitReadCtx_t gb_cxt, *gb;
        RK_S32 value;
        RK_U32 nal_type;

        mpp_set_bitread_ctx(&gb_cxt, (RK_U8 *)h->nals[i].data,
                            h->nals[i].size);
        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);

        gb = &gb_cxt;

        READ_ONEBIT(gb, &value); /*this bit should be zero*/

        READ_BITS(gb, 6, &nal_type);

        if (nal_type >= 32) {
            continue;
        }
        memcpy(current, start_code, start_code_size);
        current += start_code_size;
        position += start_code_size;
        memcpy(current, h->nals[i].data, h->nals[i].size);
        // mpp_log("h->nals[%d].size = %d", i, h->nals[i].size);
        fill_slice_short(&ctx_pic->slice_short[count], position, h->nals[i].size);
        init_slice_cut_param(&ctx_pic->slice_cut_param[count]);
        current += h->nals[i].size;
        position += h->nals[i].size;
        count++;
    }
    ctx_pic->slice_count    = count;
    ctx_pic->bitstream_size = position;
    if (-1 != input_index) {
        ctx_pic->bitstream      = (RK_U8*)ptr;

        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_HAL_INPUT);
    } else {
        ctx_pic->bitstream = NULL;
        mpp_packet_set_length(h->input_packet, position);
    }
    return MPP_OK;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}